

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

ParserResult *
Catch::Clara::Detail::convertInto(ParserResult *__return_storage_ptr__,string *source,bool *target)

{
  bool bVar1;
  ParseResultType local_98 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_40 [8];
  string srcLC;
  bool *target_local;
  string *source_local;
  
  srcLC.field_2._8_8_ = target;
  toLower((string *)local_40,source);
  bVar1 = std::operator==((string *)local_40,"y");
  if (bVar1) {
LAB_001615a7:
    *(undefined1 *)srcLC.field_2._8_8_ = 1;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"1");
    if (bVar1) goto LAB_001615a7;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"true");
    if (bVar1) goto LAB_001615a7;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"yes");
    if (bVar1) goto LAB_001615a7;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"on");
    if (bVar1) goto LAB_001615a7;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"n");
    if (!bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"0");
      if (!bVar1) {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"false");
        if (!bVar1) {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_40,"no");
          if (!bVar1) {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_40,"off");
            if (!bVar1) {
              std::operator+(&local_90,"Expected a boolean value but did not recognise: \'",source);
              std::operator+(&local_70,&local_90,"\'");
              BasicResult<Catch::Clara::ParseResultType>::runtimeError
                        (__return_storage_ptr__,&local_70);
              std::__cxx11::string::~string((string *)&local_70);
              std::__cxx11::string::~string((string *)&local_90);
              goto LAB_00161749;
            }
          }
        }
      }
    }
    *(undefined1 *)srcLC.field_2._8_8_ = 0;
  }
  local_98[0] = Matched;
  BasicResult<Catch::Clara::ParseResultType>::ok<Catch::Clara::ParseResultType>
            (__return_storage_ptr__,local_98);
LAB_00161749:
  local_98[1] = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

ParserResult convertInto(std::string const &source,
                bool &target) {
                std::string srcLC = toLower(source);

                if (srcLC == "y" || srcLC == "1" || srcLC == "true" ||
                    srcLC == "yes" || srcLC == "on") {
                    target = true;
                }
                else if (srcLC == "n" || srcLC == "0" || srcLC == "false" ||
                    srcLC == "no" || srcLC == "off") {
                    target = false;
                }
                else {
                    return ParserResult::runtimeError(
                        "Expected a boolean value but did not recognise: '" +
                        source + "'");
                }
                return ParserResult::ok(ParseResultType::Matched);
            }